

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_struct.cpp
# Opt level: O1

bool duckdb::StructToUnionCast::Cast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  unsigned_long *puVar2;
  pointer *this;
  Vector *this_00;
  UnionInvalidReason UVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_02;
  reference pvVar4;
  type pVVar5;
  reference pvVar6;
  reference pvVar7;
  idx_t iVar8;
  SelectionVector *sel_p;
  ConversionException *pCVar9;
  InternalException *this_03;
  size_type __n;
  idx_t idx;
  Vector *vector;
  bool bVar10;
  CastParameters child_parameters;
  UnifiedVectorFormat tag_data;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  bool local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  Vector *local_b0;
  pointer *local_a8;
  pointer *local_a0;
  Vector *local_98;
  idx_t local_90;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_88;
  type local_80;
  UnifiedVectorFormat local_78;
  
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  local_a0 = (pointer *)(parameters->cast_data).ptr;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&parameters->local_state);
  local_a8 = (pointer *)(parameters->local_state).ptr;
  local_98 = source;
  this_01 = StructVector::GetEntries(source);
  local_b0 = result;
  this_02 = StructVector::GetEntries(result);
  if ((this_01->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_01->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_a0 = local_a0 + 1;
    local_a8 = local_a8 + 1;
    __n = 0;
    local_90 = count;
    local_88 = this_02;
    do {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this_02,__n);
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pvVar4);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[](this_01,__n);
      local_80 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pvVar4);
      this = local_a0;
      pvVar6 = vector<duckdb::BoundCastInfo,_true>::operator[]
                         ((vector<duckdb::BoundCastInfo,_true> *)local_a0,__n);
      _Var1._M_head_impl =
           (pvVar6->cast_data).
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      pvVar7 = vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
                             *)local_a8,__n);
      local_e8._8_8_ =
           (pvVar7->
           super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
           .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
      local_f8[8] = parameters->strict;
      local_e8._M_allocated_capacity = (size_type)parameters->error_message;
      local_d8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(parameters->query_location).index;
      local_d0 = false;
      local_f8._0_8_ = _Var1._M_head_impl;
      pvVar6 = vector<duckdb::BoundCastInfo,_true>::operator[]
                         ((vector<duckdb::BoundCastInfo,_true> *)this,__n);
      this_02 = local_88;
      count = local_90;
      (*pvVar6->function)(local_80,pVVar5,local_90,(CastParameters *)local_f8);
      Vector::Flatten(pVVar5,count);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_00 = local_98;
  vector = local_b0;
  if (local_98->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(local_b0,CONSTANT_VECTOR);
    puVar2 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = (*puVar2 & 1) == 0;
    }
    ConstantVector::SetNull(vector,bVar10);
    bVar10 = false;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::operator[](this_02,0);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar4);
    puVar2 = (pVVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 != (unsigned_long *)0x0) {
      bVar10 = (*puVar2 & 1) == 0;
    }
    ConstantVector::SetNull(vector,bVar10);
  }
  else {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::operator[](this_02,0);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar4);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f8);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    vector = local_b0;
    Vector::ToUnifiedFormat(this_00,count,(UnifiedVectorFormat *)local_f8);
    Vector::ToUnifiedFormat(pVVar5,count,&local_78);
    if (count != 0) {
      idx = 0;
      do {
        iVar8 = idx;
        if (*(_func_int ***)local_f8._0_8_ != (_func_int **)0x0) {
          iVar8 = (idx_t)*(uint *)((long)*(_func_int ***)local_f8._0_8_ + idx * 4);
        }
        if (((string *)local_e8._M_allocated_capacity == (string *)0x0) ||
           ((*(ulong *)(local_e8._M_allocated_capacity + (iVar8 >> 6) * 8) >> (iVar8 & 0x3f) & 1) !=
            0)) {
          iVar8 = idx;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)(local_78.sel)->sel_vector[idx];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
               (unsigned_long *)0x0) &&
             ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) == 0)) goto LAB_00f02128;
        }
        else {
LAB_00f02128:
          FlatVector::SetNull(vector,idx,true);
        }
        idx = idx + 1;
      } while (count != idx);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
    if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
    }
  }
  sel_p = FlatVector::IncrementalSelectionVector();
  UVar3 = UnionVector::CheckUnionValidity(vector,count,sel_p);
  if (UVar3 == VALID) {
    Vector::Verify(vector,count);
    return true;
  }
  switch(UVar3) {
  case TAG_OUT_OF_RANGE:
    pCVar9 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"One or more of the tags do not point to a valid union member","")
    ;
    ConversionException::ConversionException(pCVar9,(string *)local_f8);
    __cxa_throw(pCVar9,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  default:
    this_03 = (InternalException *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Struct to union cast failed for unknown reason","");
    InternalException::InternalException(this_03,(string *)local_f8);
    __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case VALIDITY_OVERLAP:
    pCVar9 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,
               "One or more rows in the produced UNION have validity set for more than 1 member","")
    ;
    ConversionException::ConversionException(pCVar9,(string *)local_f8);
    __cxa_throw(pCVar9,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  case TAG_MISMATCH:
    pCVar9 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,
               "One or more rows in the produced UNION have tags that don\'t point to the valid member"
               ,"");
    ConversionException::ConversionException(pCVar9,(string *)local_f8);
    __cxa_throw(pCVar9,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  case NULL_TAG:
    pCVar9 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = &local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"One or more rows in the produced UNION have a NULL tag","");
    ConversionException::ConversionException(pCVar9,(string *)local_f8);
    __cxa_throw(pCVar9,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

bool StructToUnionCast::Cast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	auto &lstate = parameters.local_state->Cast<StructCastLocalState>();

	D_ASSERT(source.GetType().id() == LogicalTypeId::STRUCT);
	D_ASSERT(result.GetType().id() == LogicalTypeId::UNION);
	D_ASSERT(cast_data.target.id() == LogicalTypeId::UNION);

	auto &source_children = StructVector::GetEntries(source);
	auto &target_children = StructVector::GetEntries(result);

	for (idx_t i = 0; i < source_children.size(); i++) {
		auto &result_child_vector = *target_children[i];
		auto &source_child_vector = *source_children[i];
		CastParameters child_parameters(parameters, cast_data.child_cast_info[i].cast_data, lstate.local_states[i]);
		auto converted =
		    cast_data.child_cast_info[i].function(source_child_vector, result_child_vector, count, child_parameters);
		(void)converted;
		D_ASSERT(converted);
		// we flatten the child because we use FlatVector::SetNull below and we may get non-flat from source/cast
		result_child_vector.Flatten(count);
	}

	if (source.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, ConstantVector::IsNull(source));

		// if the tag is NULL, the union should be NULL
		auto &tag_vec = *target_children[0];
		ConstantVector::SetNull(result, ConstantVector::IsNull(tag_vec));
	} else {
		// if the tag is NULL, the union should be NULL
		auto &tag_vec = *target_children[0];
		UnifiedVectorFormat source_data, tag_data;
		source.ToUnifiedFormat(count, source_data);
		tag_vec.ToUnifiedFormat(count, tag_data);

		for (idx_t i = 0; i < count; i++) {
			if (!source_data.validity.RowIsValid(source_data.sel->get_index(i)) ||
			    !tag_data.validity.RowIsValid(tag_data.sel->get_index(i))) {
				FlatVector::SetNull(result, i, true);
			}
		}
	}

	auto check_tags = UnionVector::CheckUnionValidity(result, count);
	switch (check_tags) {
	case UnionInvalidReason::TAG_OUT_OF_RANGE:
		throw ConversionException("One or more of the tags do not point to a valid union member");
	case UnionInvalidReason::VALIDITY_OVERLAP:
		throw ConversionException("One or more rows in the produced UNION have validity set for more than 1 member");
	case UnionInvalidReason::TAG_MISMATCH:
		throw ConversionException(
		    "One or more rows in the produced UNION have tags that don't point to the valid member");
	case UnionInvalidReason::NULL_TAG:
		throw ConversionException("One or more rows in the produced UNION have a NULL tag");
	case UnionInvalidReason::VALID:
		break;
	default:
		throw InternalException("Struct to union cast failed for unknown reason");
	}

	result.Verify(count);
	return true;
}